

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O3

BOOL __thiscall
Js::TypedArray<char,_false,_false>::BaseTypedDirectSetItemNoDetachCheck
          (TypedArray<char,_false,_false> *this,uint32 index,Var value,
          _func_char_Var_ScriptContext_ptr *convFunc)

{
  uint uVar1;
  code *pcVar2;
  uchar uVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  
  uVar3 = (*convFunc)(value,(((((this->super_TypedArrayBase).super_ArrayBufferParent.
                                super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.
                               ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                            scriptContext.ptr);
  if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x1e7,"(!IsDetachedBuffer())","!IsDetachedBuffer()");
    if (!bVar4) goto LAB_00d732d3;
    *puVar6 = 0;
  }
  if ((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x1e8,"(index < GetLength())",
                                "Trying to set out of bound index for typed array.");
    if (!bVar4) goto LAB_00d732d3;
    *puVar6 = 0;
  }
  uVar1 = (this->super_TypedArrayBase).byteOffset;
  uVar5 = (*(((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->
            super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar5 < (ulong)uVar1 + (ulong)(index + 1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x1e9,
                                "((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                ,
                                "(index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                               );
    if (!bVar4) {
LAB_00d732d3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  (this->super_TypedArrayBase).buffer[index] = uVar3;
  return 1;
}

Assistant:

inline BOOL BaseTypedDirectSetItemNoDetachCheck(__in uint32 index, __in Js::Var value, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName typedValue = convFunc(value, GetScriptContext());

            // The caller of the function made sure that no IsDetached check required.
            // The caller of the function also made sure that no length check required.

            Assert(!IsDetachedBuffer());
            AssertMsg(index < GetLength(), "Trying to set out of bound index for typed array.");
            Assert((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            TypeName* typedBuffer = (TypeName*)buffer;

            typedBuffer[index] = typedValue;

            return TRUE;
        }